

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.cpp
# Opt level: O3

bool __thiscall
slang::analysis::FlowAnalysisBase::isFullyCovered(FlowAnalysisBase *this,CaseStatement *stmt)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CaseStatementCondition kind;
  size_t sVar3;
  Symbol *pSVar4;
  pair<unsigned_int,_unsigned_int> pVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  SourceRange range;
  bool bVar10;
  undefined1 uVar11;
  uint uVar13;
  bitwidth_t bVar14;
  Expression *pEVar15;
  ConstantValue *pCVar16;
  size_t sVar17;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  Diagnostic *this_01;
  byte bVar12;
  Diagnostic *pDVar18;
  char_pointer puVar19;
  char_pointer puVar20;
  pointer pIVar21;
  char_pointer puVar22;
  char_pointer puVar23;
  DiagCode code;
  long lVar24;
  ulong uVar25;
  SourceLocation SVar26;
  ulong hash;
  table_element_pointer ppVar27;
  table_element_pointer puVar28;
  ulong pos0;
  ulong uVar29;
  CaseStatement *source;
  Type *pTVar30;
  ulong uVar31;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  CaseStatement *pCVar32;
  long lVar33;
  SVInt *val;
  ConstantValue *pCVar34;
  pointer this_02;
  EnumValueSymbol *ev;
  undefined8 uVar35;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar36;
  char_pointer puVar37;
  char_pointer puVar38;
  byte bVar39;
  double extraout_XMM0_Qa;
  undefined1 auVar41 [16];
  double extraout_XMM0_Qa_00;
  undefined1 auVar42 [16];
  double dVar40;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 uVar47;
  char cVar48;
  undefined1 uVar49;
  char cVar50;
  undefined1 uVar51;
  char cVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  char cVar55;
  undefined1 uVar56;
  char cVar57;
  undefined1 uVar58;
  char cVar59;
  undefined1 uVar60;
  byte bVar61;
  undefined1 uVar62;
  char cVar63;
  undefined1 uVar64;
  char cVar65;
  undefined1 uVar66;
  char cVar67;
  undefined1 uVar68;
  byte bVar69;
  undefined1 uVar70;
  char cVar71;
  undefined1 uVar72;
  char cVar73;
  undefined1 uVar74;
  char cVar75;
  undefined1 uVar76;
  byte bVar77;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar78;
  string_view sVar79;
  iterator iVar80;
  iterator iVar81;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  bitwidth_t bitWidth;
  Type *local_408;
  CaseStatement *local_400;
  FlowAnalysisBase *local_3f8;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> local_3f0;
  ConstantValue *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [32];
  undefined8 local_3b8;
  char cStack_3b0;
  char cStack_3af;
  char cStack_3ae;
  byte bStack_3ad;
  char cStack_3ac;
  char cStack_3ab;
  char cStack_3aa;
  byte bStack_3a9;
  string msg;
  locator res;
  undefined1 local_368;
  Expression *item;
  StatementSyntax *local_328;
  SourceLocation local_320;
  Expression local_318;
  pointer local_2e0;
  pointer local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  SmallVector<slang::SVInt,_2UL> intVals;
  SmallVector<const_slang::ast::Expression_*,_5UL> itemExpressions;
  optional<slang::analysis::CaseDecisionDag> decisionDag;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  elems;
  
  local_408 = (stmt->expr->type).ptr;
  source = stmt;
  pEVar15 = ast::Expression::unwrapImplicitConversions(stmt->expr);
  bitWidth = ast::Type::getBitWidth((pEVar15->type).ptr);
  kind = stmt->condition;
  elems.super_Storage.ptr = (char *)&elems;
  elems._208_8_ = 0x3f;
  elems._216_8_ = 1;
  elems._224_16_ = ZEXT816(0x470b30);
  elems._240_16_ = (undefined1  [16])0x0;
  intVals.super_SmallVectorBase<slang::SVInt>.data_ =
       (pointer)intVals.super_SmallVectorBase<slang::SVInt>.firstElement;
  uVar35 = 0;
  intVals.super_SmallVectorBase<slang::SVInt>.len = 0;
  intVals.super_SmallVectorBase<slang::SVInt>.cap = 2;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  sVar3 = (stmt->items)._M_extent._M_extent_value;
  local_400 = stmt;
  local_3f8 = this;
  elems.super_Storage._200_8_ = elems.super_Storage.ptr;
  if (sVar3 != 0) {
    pIVar21 = (stmt->items)._M_ptr;
    local_2e0 = pIVar21 + sVar3;
    local_3f0.current = (Symbol *)&this->evalContext;
    uVar35 = 0;
    do {
      sVar3 = (pIVar21->expressions)._M_extent._M_extent_value;
      local_2d8 = pIVar21;
      if (sVar3 != 0) {
        pCVar34 = (ConstantValue *)(pIVar21->expressions)._M_ptr;
        local_3e8 = (ConstantValue *)
                    ((long)&(pCVar34->value).
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + sVar3 * 8);
        do {
          source = *(CaseStatement **)
                    &(pCVar34->value).
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ;
          item = (Expression *)source;
          pCVar16 = ast::Expression::eval
                              ((ConstantValue *)&decisionDag,(Expression *)source,
                               (EvalContext *)local_3f0.current);
          if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
              _M_payload.
              super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
              super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2[0x20]
              == '\0') {
            local_3e0 = CONCAT71((int7)((ulong)pCVar16 >> 8),1);
          }
          else {
            sVar17 = ConstantValue::hash((ConstantValue *)&decisionDag);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = sVar17;
            hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
            pos0 = hash >> (elems._208_1_ & 0x3f);
            lVar24 = (hash & 0xff) * 4;
            uVar47 = (&UNK_0047072c)[lVar24];
            uVar49 = (&UNK_0047072d)[lVar24];
            uVar51 = (&UNK_0047072e)[lVar24];
            uVar53 = (&UNK_0047072f)[lVar24];
            uVar31 = (ulong)((uint)hash & 7);
            uVar29 = 0;
            uVar25 = pos0;
            uVar54 = uVar47;
            uVar56 = uVar49;
            uVar58 = uVar51;
            uVar60 = uVar53;
            uVar62 = uVar47;
            uVar64 = uVar49;
            uVar66 = uVar51;
            uVar68 = uVar53;
            uVar70 = uVar47;
            uVar72 = uVar49;
            uVar74 = uVar51;
            uVar76 = uVar53;
            local_3e0 = uVar35;
            do {
              pcVar1 = (char *)(elems._224_8_ + uVar25 * 0x10);
              uVar11 = pcVar1[0xf];
              auVar41[0] = -(*pcVar1 == uVar47);
              auVar41[1] = -(pcVar1[1] == uVar49);
              auVar41[2] = -(pcVar1[2] == uVar51);
              auVar41[3] = -(pcVar1[3] == uVar53);
              auVar41[4] = -(pcVar1[4] == uVar54);
              auVar41[5] = -(pcVar1[5] == uVar56);
              auVar41[6] = -(pcVar1[6] == uVar58);
              auVar41[7] = -(pcVar1[7] == uVar60);
              auVar41[8] = -(pcVar1[8] == uVar62);
              auVar41[9] = -(pcVar1[9] == uVar64);
              auVar41[10] = -(pcVar1[10] == uVar66);
              auVar41[0xb] = -(pcVar1[0xb] == uVar68);
              auVar41[0xc] = -(pcVar1[0xc] == uVar70);
              auVar41[0xd] = -(pcVar1[0xd] == uVar72);
              auVar41[0xe] = -(pcVar1[0xe] == uVar74);
              auVar41[0xf] = -(uVar11 == uVar76);
              uVar13 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
              if (uVar13 != 0) {
                local_318.sourceRange.startLoc._1_1_ = uVar49;
                local_318.sourceRange.startLoc._0_1_ = uVar47;
                local_318.sourceRange.startLoc._2_1_ = uVar51;
                local_318.sourceRange.startLoc._3_1_ = uVar53;
                local_318.sourceRange.startLoc._4_1_ = uVar54;
                local_318.sourceRange.startLoc._5_1_ = uVar56;
                local_318.sourceRange.startLoc._6_1_ = uVar58;
                local_318.sourceRange.startLoc._7_1_ = uVar60;
                lVar33 = elems._224_8_ + uVar25 * 0x10;
                lVar24 = elems._232_8_ + uVar25 * 0x2d0;
                local_3b8 = pCVar34;
                local_318.sourceRange.endLoc._0_1_ = uVar62;
                local_318.sourceRange.endLoc._1_1_ = uVar64;
                local_318.sourceRange.endLoc._2_1_ = uVar66;
                local_318.sourceRange.endLoc._3_1_ = uVar68;
                local_318.sourceRange.endLoc._4_1_ = uVar70;
                local_318.sourceRange.endLoc._5_1_ = uVar72;
                local_318.sourceRange.endLoc._6_1_ = uVar74;
                local_318.sourceRange.endLoc._7_1_ = uVar76;
                local_2d0 = uVar31;
                local_2c8 = uVar29;
                local_2c0 = uVar25;
                do {
                  iVar6 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                    }
                  }
                  pCVar32 = (CaseStatement *)((ulong)(uint)(iVar6 * 0x30) + lVar24);
                  source = pCVar32;
                  bVar10 = slang::operator==((ConstantValue *)&decisionDag,(ConstantValue *)pCVar32)
                  ;
                  this = local_3f8;
                  pCVar34 = local_3b8;
                  if (bVar10) {
                    if (local_3f8->diagnostics != (Diagnostics *)0x0) {
                      pDVar18 = Diagnostics::add(local_3f8->diagnostics,local_3f8->rootSymbol,
                                                 (DiagCode)0xd000e,item->sourceRange);
                      pCVar34 = local_3b8;
                      sVar79 = ast::SemanticFacts::getCaseConditionStr(kind);
                      this_01 = Diagnostic::operator<<(pDVar18,sVar79);
                      Diagnostic::operator<<(this_01,(ConstantValue *)pCVar32);
                      pSVar4 = (Symbol *)(pCVar32->items)._M_ptr;
                      range.startLoc = (SourceLocation)pSVar4->parentScope;
                      range.endLoc = (SourceLocation)pSVar4->nextInScope;
                      source = (CaseStatement *)0xc0001;
                      Diagnostic::addNote(pDVar18,(DiagCode)0xc0001,range);
                    }
                    goto LAB_0044e1ae;
                  }
                  uVar13 = uVar13 - 1 & uVar13;
                } while (uVar13 != 0);
                uVar11 = *(byte *)(lVar33 + 0xf);
                uVar25 = local_2c0;
                uVar29 = local_2c8;
                uVar31 = local_2d0;
                uVar47 = local_318.sourceRange.startLoc._0_1_;
                uVar49 = local_318.sourceRange.startLoc._1_1_;
                uVar51 = local_318.sourceRange.startLoc._2_1_;
                uVar53 = local_318.sourceRange.startLoc._3_1_;
                uVar54 = local_318.sourceRange.startLoc._4_1_;
                uVar56 = local_318.sourceRange.startLoc._5_1_;
                uVar58 = local_318.sourceRange.startLoc._6_1_;
                uVar60 = local_318.sourceRange.startLoc._7_1_;
                uVar62 = local_318.sourceRange.endLoc._0_1_;
                uVar64 = local_318.sourceRange.endLoc._1_1_;
                uVar66 = local_318.sourceRange.endLoc._2_1_;
                uVar68 = local_318.sourceRange.endLoc._3_1_;
                uVar70 = local_318.sourceRange.endLoc._4_1_;
                uVar72 = local_318.sourceRange.endLoc._5_1_;
                uVar74 = local_318.sourceRange.endLoc._6_1_;
                uVar76 = local_318.sourceRange.endLoc._7_1_;
              }
              this = local_3f8;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[uVar31] & uVar11) == None >> 0x18)
              break;
              lVar24 = uVar25 + uVar29;
              uVar29 = uVar29 + 1;
              uVar25 = lVar24 + 1U & elems._216_8_;
            } while (uVar29 <= (ulong)elems._216_8_);
            if ((ulong)elems._248_8_ < (ulong)elems._240_8_) {
              source = (CaseStatement *)&elems.super_Storage.field_0xc8;
              in_R9.values_ = (value<fmt::v11::context> *)&msg;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                               *)source,(arrays_type *)&elems.field_0xd0,pos0,hash,
                         (try_emplace_args_t *)in_R9.values_,(ConstantValue *)&decisionDag,&item);
              elems._248_8_ = elems._248_8_ + 1;
            }
            else {
              source = (CaseStatement *)&elems.super_Storage.field_0xc8;
              in_R9.values_ = (value<fmt::v11::context> *)&item;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                               *)source,hash,(try_emplace_args_t *)&msg,
                         (ConstantValue *)&decisionDag,(Expression **)in_R9.values_);
            }
            if ((*(__index_type *)
                  ((long)&((res.p)->first).value.
                          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          .
                          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  + 0x20) == '\x01') &&
               ((this_00 = std::
                           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)res.p), dVar40 = extraout_XMM0_Qa, kind != WildcardJustZ ||
                (bVar14 = SVInt::countXs(this_00), dVar40 = extraout_XMM0_Qa_00, bVar14 == 0)))) {
              SVInt::trunc((SVInt *)&res,dVar40);
              SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt>
                        (&intVals.super_SmallVectorBase<slang::SVInt>,(SVInt *)&res);
              if (((0x40 < res.n) || ((res._8_8_ & 0x10000000000) != 0)) &&
                 (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)0x0)) {
                operator_delete__(res.pg);
              }
              source = (CaseStatement *)&item;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*const&>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)&itemExpressions,
                         (Expression **)source);
            }
          }
LAB_0044e1ae:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&decisionDag);
          if ((this->diagnostics != (Diagnostics *)0x0 && (kind & ~WildcardJustZ) == Normal) &&
             (pEVar15 = ast::Expression::unwrapImplicitConversions(item),
             pEVar15->kind == IntegerLiteral)) {
            if (kind == WildcardJustZ) {
              source = (CaseStatement *)&pEVar15[1].type;
              SVInt::SVInt((SVInt *)&decisionDag,(SVIntStorage *)source);
              bVar14 = SVInt::countXs((SVInt *)&decisionDag);
              if (((0x40 < (uint)decisionDag.
                                 super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                                 .super__Optional_payload_base<slang::analysis::CaseDecisionDag>.
                                 _M_payload._M_value.unreachableClauses.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 .arrays.groups_size_mask._0_4_) ||
                  ((decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                    ._M_payload.
                    super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                    super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                    [0xd] & 1) != 0)) &&
                 (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                  _M_payload.
                  super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                  super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value
                  .unreachableClauses.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  .arrays.groups_size_index != 0)) {
                operator_delete__((void *)decisionDag.
                                          super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<slang::analysis::CaseDecisionDag>
                                          ._M_payload._M_value.unreachableClauses.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                          .arrays.groups_size_index);
              }
              code.subsystem = Analysis;
              code.code = 0x14;
              if (bVar14 != 0) {
LAB_0044e288:
                source = (CaseStatement *)this->rootSymbol;
                Diagnostics::add(this->diagnostics,(Symbol *)source,code,item->sourceRange);
              }
            }
            else if (kind == Normal) {
              source = (CaseStatement *)&pEVar15[1].type;
              SVInt::SVInt((SVInt *)&decisionDag,(SVIntStorage *)source);
              uVar47 = decisionDag.
                       super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                       _M_payload.
                       super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                       .super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.
                       field2[0xd];
              if ((0x40 < (uint)decisionDag.
                                super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                                ._M_payload.
                                super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                                .super__Optional_payload_base<slang::analysis::CaseDecisionDag>.
                                _M_payload._M_value.unreachableClauses.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                .arrays.groups_size_mask._0_4_ ||
                   (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                    ._M_payload.
                    super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                    super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                    [0xd] & 1) != 0) &&
                 (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                  _M_payload.
                  super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                  super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value
                  .unreachableClauses.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  .arrays.groups_size_index != 0)) {
                operator_delete__((void *)decisionDag.
                                          super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<slang::analysis::CaseDecisionDag>
                                          ._M_payload._M_value.unreachableClauses.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                          .arrays.groups_size_index);
              }
              code.subsystem = Analysis;
              code.code = 0x11;
              if ((uVar47 & 1) != 0) goto LAB_0044e288;
            }
          }
          pCVar34 = (ConstantValue *)
                    ((long)&(pCVar34->value).
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + 8);
          uVar35 = local_3e0;
        } while (pCVar34 != local_3e8);
      }
      pIVar21 = local_2d8 + 1;
    } while (pIVar21 != local_2e0);
  }
  decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>._M_payload.
  super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
  super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged = false;
  local_3e0 = uVar35;
  if (this->diagnostics != (Diagnostics *)0x0) {
    pTVar30 = local_408->canonical;
    if (pTVar30 == (Type *)0x0) {
      ast::Type::resolveCanonical(local_408);
      pTVar30 = local_408->canonical;
    }
    if ((pTVar30->super_Symbol).kind == EnumType) {
      item = &local_318;
      local_328 = (StatementSyntax *)0x0;
      local_320 = (SourceLocation)0x2;
      sVar78 = ast::Scope::membersOfType<slang::ast::EnumValueSymbol>
                         ((Scope *)&pTVar30[1].super_Symbol.name);
      if (sVar78._M_begin.current.current != sVar78._M_end.current.current) {
        do {
          local_3f0 = sVar78._M_end.current;
          sVar36 = sVar78._M_begin.current;
          local_3e8 = ast::EnumValueSymbol::getValue
                                ((EnumValueSymbol *)sVar36.current,(SourceRange)ZEXT816(0));
          sVar17 = ConstantValue::hash(local_3e8);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = sVar17;
          uVar25 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar29 = uVar25 >> (elems._208_1_ & 0x3f);
          lVar24 = (uVar25 & 0xff) * 4;
          cVar48 = (&UNK_0047072c)[lVar24];
          cVar50 = (&UNK_0047072d)[lVar24];
          cVar52 = (&UNK_0047072e)[lVar24];
          bVar39 = (&UNK_0047072f)[lVar24];
          SVar26 = (SourceLocation)0x0;
          cVar55 = cVar48;
          cVar57 = cVar50;
          cVar59 = cVar52;
          bVar61 = bVar39;
          cVar63 = cVar48;
          cVar65 = cVar50;
          cVar67 = cVar52;
          bVar69 = bVar39;
          cVar71 = cVar48;
          cVar73 = cVar50;
          cVar75 = cVar52;
          bVar77 = bVar39;
          do {
            pcVar1 = (char *)(elems._224_8_ + uVar29 * 0x10);
            bVar12 = pcVar1[0xf];
            auVar42[0] = -(*pcVar1 == cVar48);
            auVar42[1] = -(pcVar1[1] == cVar50);
            auVar42[2] = -(pcVar1[2] == cVar52);
            auVar42[3] = -(pcVar1[3] == bVar39);
            auVar42[4] = -(pcVar1[4] == cVar55);
            auVar42[5] = -(pcVar1[5] == cVar57);
            auVar42[6] = -(pcVar1[6] == cVar59);
            auVar42[7] = -(pcVar1[7] == bVar61);
            auVar42[8] = -(pcVar1[8] == cVar63);
            auVar42[9] = -(pcVar1[9] == cVar65);
            auVar42[10] = -(pcVar1[10] == cVar67);
            auVar42[0xb] = -(pcVar1[0xb] == bVar69);
            auVar42[0xc] = -(pcVar1[0xc] == cVar71);
            auVar42[0xd] = -(pcVar1[0xd] == cVar73);
            auVar42[0xe] = -(pcVar1[0xe] == cVar75);
            auVar42[0xf] = -(bVar12 == bVar77);
            uVar13 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
            if (uVar13 != 0) {
              local_3b8 = (ConstantValue *)
                          CONCAT17(bVar61,CONCAT16(cVar59,CONCAT15(cVar57,CONCAT14(cVar55,CONCAT13(
                                                  bVar39,CONCAT12(cVar52,CONCAT11(cVar50,cVar48)))))
                                                  ));
              lVar33 = elems._224_8_ + uVar29 * 0x10;
              lVar24 = elems._232_8_ + uVar29 * 0x2d0;
              cStack_3b0 = cVar63;
              cStack_3af = cVar65;
              cStack_3ae = cVar67;
              bStack_3ad = bVar69;
              cStack_3ac = cVar71;
              cStack_3ab = cVar73;
              cStack_3aa = cVar75;
              bStack_3a9 = bVar77;
              local_318.sourceRange.startLoc = SVar26;
              do {
                iVar6 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                  }
                }
                source = (CaseStatement *)((ulong)(uint)(iVar6 * 0x30) + lVar24);
                bVar10 = slang::operator==(local_3e8,(ConstantValue *)source);
                if (bVar10) goto LAB_0044e4b2;
                uVar13 = uVar13 - 1 & uVar13;
              } while (uVar13 != 0);
              bVar12 = *(byte *)(lVar33 + 0xf);
              SVar26 = local_318.sourceRange.startLoc;
              cVar48 = (char)local_3b8;
              cVar50 = local_3b8._1_1_;
              cVar52 = local_3b8._2_1_;
              bVar39 = local_3b8._3_1_;
              cVar55 = local_3b8._4_1_;
              cVar57 = local_3b8._5_1_;
              cVar59 = local_3b8._6_1_;
              bVar61 = local_3b8._7_1_;
              cVar63 = cStack_3b0;
              cVar65 = cStack_3af;
              cVar67 = cStack_3ae;
              bVar69 = bStack_3ad;
              cVar71 = cStack_3ac;
              cVar73 = cStack_3ab;
              cVar75 = cStack_3aa;
              bVar77 = bStack_3a9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7] & bVar12) == 0) break;
            lVar24 = uVar29 + (long)SVar26;
            SVar26 = (SourceLocation)((long)SVar26 + 1);
            uVar29 = lVar24 + 1U & elems._216_8_;
          } while ((ulong)SVar26 <= (ulong)elems._216_8_);
          source = (CaseStatement *)&(sVar36.current)->name;
          SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)&item,
                     (basic_string_view<char,_std::char_traits<char>_> *)source);
LAB_0044e4b2:
          sVar36.current = (sVar36.current)->nextInScope;
          if (sVar36.current == (Symbol *)0x0) {
            sVar36.current = (Symbol *)0x0;
          }
          else {
            do {
              if ((sVar36.current)->kind == EnumValue) goto LAB_0044e4ee;
              sVar36.current = (sVar36.current)->nextInScope;
            } while (sVar36.current != (Symbol *)0x0);
            sVar36.current = (Symbol *)0x0;
          }
LAB_0044e4ee:
          sVar78._M_end.current = local_3f0.current;
          sVar78._M_begin.current = sVar36.current;
          this = local_3f8;
        } while (sVar36.current != local_3f0.current);
      }
      if (local_328 != (StatementSyntax *)0x0) {
        paVar2 = &msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        msg._M_dataplus._M_p = (pointer)paVar2;
        if (local_328 == (StatementSyntax *)0x3) {
          res.n = item->kind;
          res._12_4_ = *(undefined4 *)&item->field_0x4;
          res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
          res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax;
          local_368 = SUB81((item->sourceRange).endLoc,0);
          fmt_01.size_ = 0xddd;
          fmt_01.data_ = (char *)0x1b;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&res;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_3d8,(v11 *)"values \'{}\', \'{}\', and \'{}\'",fmt_01,args_01);
LAB_0044ec10:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3d8);
          pTVar30 = (Type *)local_3d8._0_8_;
          if ((Type *)local_3d8._0_8_ != (Type *)(local_3d8 + 0x10)) {
LAB_0044ec34:
            operator_delete(pTVar30,(size_t)((long)&(((
                                                  pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>
                                                  *)local_3d8._16_8_)->first).value.
                                                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                            + 1));
          }
        }
        else {
          if (local_328 == (StatementSyntax *)0x2) {
            res.n = item->kind;
            res._12_4_ = *(undefined4 *)&item->field_0x4;
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
            res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax
            ;
            fmt_00.size_ = 0xdd;
            fmt_00.data_ = (char *)0x14;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)&res;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_3d8,(v11 *)"values \'{}\' and \'{}\'",fmt_00,args_00);
            goto LAB_0044ec10;
          }
          if (local_328 != (StatementSyntax *)0x1) {
            res.n = item->kind;
            res._12_4_ = *(undefined4 *)&item->field_0x4;
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
            res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax
            ;
            local_368 = SUB81((item->sourceRange).endLoc,0);
            fmt_02.size_ = 0xc4ddd;
            fmt_02.data_ = (char *)0x28;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&res;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_3d8,(v11 *)"values \'{}\', \'{}\', \'{}\' (and {} other{})",
                       fmt_02,args_02);
            goto LAB_0044ec10;
          }
          local_3d8._8_8_ = *(undefined8 *)item;
          local_3d8._0_8_ = (item->type).ptr;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0xa;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_3d8;
          ::fmt::v11::vformat_abi_cxx11_((string *)&res,(v11 *)0x495b76,fmt,args);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res)
          ;
          local_3d8._16_8_ = res.p;
          pTVar30 = (Type *)res.pg;
          if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)&res.p)
          goto LAB_0044ec34;
        }
        pDVar18 = Diagnostics::add(this->diagnostics,this->rootSymbol,
                                   (DiagCode)
                                   ((uint)(local_400->defaultCase != (Statement *)0x0) << 0x10 |
                                   0xe000e),local_400->expr->sourceRange);
        source = (CaseStatement *)&msg;
        Diagnostic::operator<<(pDVar18,(string *)source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar2) {
          source = (CaseStatement *)
                   (CONCAT71(msg.field_2._M_allocated_capacity._1_7_,msg.field_2._M_local_buf[0]) +
                   1);
          operator_delete(msg._M_dataplus._M_p,(size_t)source);
        }
      }
      if (item != &local_318) {
        operator_delete(item);
      }
    }
    if (kind - WildcardXOrZ < 2) {
      res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
               CONCAT71(res.pg._1_7_,kind == WildcardXOrZ);
      source = (CaseStatement *)&intVals;
      std::optional<slang::analysis::CaseDecisionDag>::
      emplace<slang::SmallVector<slang::SVInt,2ul>&,unsigned_int_const&,bool,unsigned_int_const&>
                (&decisionDag,(SmallVector<slang::SVInt,_2UL> *)source,&bitWidth,(bool *)&res,
                 &(this->options).maxCaseAnalysisSteps);
      if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
          _M_payload.super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
          super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.gaveUp
          == true) {
        pDVar18 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0xc000e,
                                   local_400->expr->sourceRange);
        sVar79 = ast::SemanticFacts::getCaseConditionStr(kind);
        source = (CaseStatement *)sVar79._M_len;
        Diagnostic::operator<<(pDVar18,sVar79);
      }
      else {
        if ((decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
             _M_payload.
             super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
             super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.
             counterexample.super__Optional_base<slang::SVInt,_false,_false>._M_payload.
             super__Optional_payload<slang::SVInt,_true,_false,_false>.
             super__Optional_payload_base<slang::SVInt>._M_engaged == true) &&
           (local_400->defaultCase == (Statement *)0x0)) {
          pDVar18 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x10000e,
                                     local_400->expr->sourceRange);
          sVar79 = ast::SemanticFacts::getCaseConditionStr(kind);
          Diagnostic::operator<<(pDVar18,sVar79);
          SVInt::SVInt((SVInt *)&res,
                       (SVIntStorage *)
                       &decisionDag.
                        super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                        _M_payload.
                        super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                        .super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.
                        _M_value.counterexample);
          source = (CaseStatement *)&res;
          local_368 = WildcardXOrZ;
          Diagnostic::operator<<(pDVar18,(ConstantValue *)source);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&res);
        }
        iVar80 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::begin((table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&decisionDag);
        if (iVar80.p_ != (table_element_pointer)0x0) {
LAB_0044ea14:
          do {
            pDVar18 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x13000e,
                                       itemExpressions.
                                       super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                       [*iVar80.p_]->sourceRange);
            sVar79 = ast::SemanticFacts::getCaseConditionStr(kind);
            source = (CaseStatement *)sVar79._M_len;
            Diagnostic::operator<<(pDVar18,sVar79);
            puVar23 = iVar80.pc_ + 0x12;
            puVar38 = iVar80.pc_ + 2;
LAB_0044ea62:
            puVar20 = puVar38;
            puVar38 = iVar80.pc_;
            puVar28 = iVar80.p_ + 1;
            if (((uint)iVar80.pc_ & 0xf) != 0xe) goto code_r0x0044ea71;
            auVar45[0] = -(*puVar20 == '\0');
            auVar45[1] = -(puVar20[1] == '\0');
            auVar45[2] = -(puVar20[2] == '\0');
            auVar45[3] = -(puVar20[3] == '\0');
            auVar45[4] = -(puVar20[4] == '\0');
            auVar45[5] = -(puVar20[5] == '\0');
            auVar45[6] = -(puVar20[6] == '\0');
            auVar45[7] = -(puVar20[7] == '\0');
            auVar45[8] = -(puVar20[8] == '\0');
            auVar45[9] = -(puVar20[9] == '\0');
            auVar45[10] = -(puVar20[10] == '\0');
            auVar45[0xb] = -(puVar20[0xb] == '\0');
            auVar45[0xc] = -(puVar20[0xc] == '\0');
            auVar45[0xd] = -(puVar20[0xd] == '\0');
            auVar45[0xe] = -(puVar20[0xe] == '\0');
            auVar45[0xf] = -(puVar20[0xf] == '\0');
            uVar9 = (ushort)(SUB161(auVar45 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe;
            while (uVar9 == 0x7fff) {
              puVar28 = puVar28 + 0xf;
              auVar46[0] = -(*puVar23 == '\0');
              auVar46[1] = -(puVar23[1] == '\0');
              auVar46[2] = -(puVar23[2] == '\0');
              auVar46[3] = -(puVar23[3] == '\0');
              auVar46[4] = -(puVar23[4] == '\0');
              auVar46[5] = -(puVar23[5] == '\0');
              auVar46[6] = -(puVar23[6] == '\0');
              auVar46[7] = -(puVar23[7] == '\0');
              auVar46[8] = -(puVar23[8] == '\0');
              auVar46[9] = -(puVar23[9] == '\0');
              auVar46[10] = -(puVar23[10] == '\0');
              auVar46[0xb] = -(puVar23[0xb] == '\0');
              auVar46[0xc] = -(puVar23[0xc] == '\0');
              auVar46[0xd] = -(puVar23[0xd] == '\0');
              auVar46[0xe] = -(puVar23[0xe] == '\0');
              auVar46[0xf] = -(puVar23[0xf] == '\0');
              puVar20 = puVar23;
              puVar23 = puVar23 + 0x10;
              uVar9 = (ushort)(SUB161(auVar46 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe;
            }
            uVar13 = 0;
            if ((uVar9 ^ 0x7fff) != 0) {
              for (; ((uVar9 ^ 0x7fff) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            if (puVar20[uVar13] == '\x01') break;
            iVar80.p_ = puVar28 + uVar13;
            iVar80.pc_ = puVar20 + uVar13;
          } while( true );
        }
LAB_0044e83c:
        iVar81 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::begin(&decisionDag.
                          super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                          _M_payload.
                          super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                          .super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload
                          ._M_value.overlappingClauses.table_);
        if (iVar81.p_ != (table_element_pointer)0x0) {
LAB_0044e85d:
          do {
            pVar5 = *iVar81.p_;
            pDVar18 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x12000e,
                                       itemExpressions.
                                       super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                       [(ulong)pVar5 >> 0x20]->sourceRange);
            sVar79 = ast::SemanticFacts::getCaseConditionStr(kind);
            pDVar18 = Diagnostic::operator<<(pDVar18,sVar79);
            source = (CaseStatement *)0xc0001;
            Diagnostic::addNote(pDVar18,(DiagCode)0xc0001,
                                itemExpressions.
                                super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                [(ulong)pVar5 & 0xffffffff]->sourceRange);
            puVar22 = iVar81.pc_ + 0x12;
            puVar37 = iVar81.pc_ + 2;
LAB_0044e8d7:
            puVar19 = puVar37;
            puVar37 = iVar81.pc_;
            ppVar27 = iVar81.p_ + 1;
            if (((uint)iVar81.pc_ & 0xf) != 0xe) goto code_r0x0044e8e6;
            auVar43[0] = -(*puVar19 == '\0');
            auVar43[1] = -(puVar19[1] == '\0');
            auVar43[2] = -(puVar19[2] == '\0');
            auVar43[3] = -(puVar19[3] == '\0');
            auVar43[4] = -(puVar19[4] == '\0');
            auVar43[5] = -(puVar19[5] == '\0');
            auVar43[6] = -(puVar19[6] == '\0');
            auVar43[7] = -(puVar19[7] == '\0');
            auVar43[8] = -(puVar19[8] == '\0');
            auVar43[9] = -(puVar19[9] == '\0');
            auVar43[10] = -(puVar19[10] == '\0');
            auVar43[0xb] = -(puVar19[0xb] == '\0');
            auVar43[0xc] = -(puVar19[0xc] == '\0');
            auVar43[0xd] = -(puVar19[0xd] == '\0');
            auVar43[0xe] = -(puVar19[0xe] == '\0');
            auVar43[0xf] = -(puVar19[0xf] == '\0');
            uVar9 = (ushort)(SUB161(auVar43 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe;
            while (uVar9 == 0x7fff) {
              ppVar27 = ppVar27 + 0xf;
              auVar44[0] = -(*puVar22 == '\0');
              auVar44[1] = -(puVar22[1] == '\0');
              auVar44[2] = -(puVar22[2] == '\0');
              auVar44[3] = -(puVar22[3] == '\0');
              auVar44[4] = -(puVar22[4] == '\0');
              auVar44[5] = -(puVar22[5] == '\0');
              auVar44[6] = -(puVar22[6] == '\0');
              auVar44[7] = -(puVar22[7] == '\0');
              auVar44[8] = -(puVar22[8] == '\0');
              auVar44[9] = -(puVar22[9] == '\0');
              auVar44[10] = -(puVar22[10] == '\0');
              auVar44[0xb] = -(puVar22[0xb] == '\0');
              auVar44[0xc] = -(puVar22[0xc] == '\0');
              auVar44[0xd] = -(puVar22[0xd] == '\0');
              auVar44[0xe] = -(puVar22[0xe] == '\0');
              auVar44[0xf] = -(puVar22[0xf] == '\0');
              puVar19 = puVar22;
              puVar22 = puVar22 + 0x10;
              uVar9 = (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe;
            }
            uVar13 = 0;
            if ((uVar9 ^ 0x7fff) != 0) {
              for (; ((uVar9 ^ 0x7fff) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            if (puVar19[uVar13] == '\x01') break;
            iVar81.p_ = ppVar27 + uVar13;
            iVar81.pc_ = puVar19 + uVar13;
          } while( true );
        }
      }
    }
  }
LAB_0044e5a3:
  if ((((this->options).flags.m_bits & 2) != 0) &&
     (bVar39 = 1, (local_400->check | Unique0) == Priority)) goto LAB_0044e612;
  bVar10 = ast::Type::isIntegral(local_408);
  pCVar32 = local_400;
  if (((~bVar10 | (byte)local_3e0) & 1) == 0) {
    source = (CaseStatement *)local_400->expr;
    ast::Expression::eval((ConstantValue *)&res,(Expression *)source,&this->evalContext);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&res);
    if (pCVar32->condition != Inside && local_368 == Normal) {
      uVar13 = (this->options).flags.m_bits;
      if ((pCVar32->condition == Normal) || (bVar10 = ast::Type::isFourState(local_408), !bVar10)) {
        bVar10 = ast::Type::isFourState(local_408);
        uVar35 = elems._248_8_;
        if (bVar10 && (uVar13 & 4) != 0) {
          if (bitWidth < 0x10) {
            dVar40 = exp2((double)(int)(bitWidth * 2));
            bVar39 = (ulong)((long)(dVar40 - 9.223372036854776e+18) & (long)dVar40 >> 0x3f |
                            (long)dVar40) <= (ulong)uVar35;
            goto LAB_0044e612;
          }
        }
        else if (bitWidth < 0x20) {
          bVar39 = (ulong)elems._248_8_ >> ((byte)bitWidth & 0x3f) != 0;
          goto LAB_0044e612;
        }
      }
      else {
        if ((uVar13 & 4) == 0) {
          if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
              _M_payload.
              super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
              super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged == false) {
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                     CONCAT71(res.pg._1_7_,kind == WildcardXOrZ);
            source = (CaseStatement *)&intVals;
            std::optional<slang::analysis::CaseDecisionDag>::
            emplace<slang::SmallVector<slang::SVInt,2ul>&,unsigned_int_const&,bool,unsigned_int_const&>
                      (&decisionDag,(SmallVector<slang::SVInt,_2UL> *)source,&bitWidth,(bool *)&res,
                       &(this->options).maxCaseAnalysisSteps);
          }
          bVar39 = decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                   _M_payload.
                   super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                   super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                   [0x70] ^ 1;
          goto LAB_0044e612;
        }
        if (intVals.super_SmallVectorBase<slang::SVInt>.len != 0) {
          lVar24 = intVals.super_SmallVectorBase<slang::SVInt>.len * 0x10;
          this_02 = intVals.super_SmallVectorBase<slang::SVInt>.data_;
          do {
            lVar24 = lVar24 + -0x10;
            bVar14 = SVInt::countLeadingZs(this_02);
            bVar39 = bitWidth <= bVar14;
            if ((bool)bVar39) break;
            this_02 = this_02 + 1;
          } while (lVar24 != 0);
          goto LAB_0044e612;
        }
      }
    }
  }
  bVar39 = 0;
LAB_0044e612:
  if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>._M_payload.
      super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
      super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged == true) {
    std::_Optional_payload_base<slang::analysis::CaseDecisionDag>::_M_destroy
              ((_Optional_payload_base<slang::analysis::CaseDecisionDag> *)&decisionDag);
  }
  if (itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
      (pointer)itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement) {
    operator_delete(itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
  }
  SmallVectorBase<slang::SVInt>::cleanup
            (&intVals.super_SmallVectorBase<slang::SVInt>,(EVP_PKEY_CTX *)source);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                 *)&elems.super_Storage.field_0xc8);
  return (bool)bVar39;
code_r0x0044ea71:
  iVar80.p_ = puVar28;
  iVar80.pc_ = puVar38 + 1;
  puVar23 = puVar23 + 1;
  puVar38 = puVar20 + 1;
  if (puVar20[-1] != '\0') goto code_r0x0044ea82;
  goto LAB_0044ea62;
code_r0x0044ea82:
  if (puVar20[-1] == '\x01') goto LAB_0044e83c;
  iVar80.pc_ = puVar20 + -1;
  goto LAB_0044ea14;
code_r0x0044e8e6:
  iVar81.p_ = ppVar27;
  iVar81.pc_ = puVar37 + 1;
  puVar22 = puVar22 + 1;
  puVar37 = puVar19 + 1;
  if (puVar19[-1] != '\0') goto code_r0x0044e8f7;
  goto LAB_0044e8d7;
code_r0x0044e8f7:
  if (puVar19[-1] == '\x01') goto LAB_0044e5a3;
  iVar81.pc_ = puVar19 + -1;
  goto LAB_0044e85d;
}

Assistant:

bool FlowAnalysisBase::isFullyCovered(const CaseStatement& stmt) const {
    // This method determines whether a case statement's items fully cover
    // the input space, so that we know whether the default statement
    // (if there is one) is reachable or not.
    //
    // Also while we're here we will issue some diagnostics for lint issues like
    // overlapping case items and duplicate case items, if this analysis has been
    // configured to report diagnostics.

    const auto& caseType = *stmt.expr.type;
    const auto bitWidth = stmt.expr.unwrapImplicitConversions().type->getBitWidth();
    const auto cond = stmt.condition;
    const bool wildcard = cond == CaseStatementCondition::WildcardXOrZ ||
                          cond == CaseStatementCondition::WildcardJustZ;

    // Collect all constant case values, checking for duplicates and overlaps
    // if we are looking for diagnostics.
    bool hasNonConstItems = false;
    SmallMap<ConstantValue, const Expression*, 4> elems;
    SmallVector<SVInt> intVals;
    SmallVector<const Expression*> itemExpressions;
    for (auto& g : stmt.items) {
        for (auto item : g.expressions) {
            if (auto cv = item->eval(evalContext)) {
                auto [it, inserted] = elems.emplace(std::move(cv), item);
                if (!inserted) {
                    if (diagnostics) {
                        auto& diag = diagnostics->add(rootSymbol, diag::CaseDup, item->sourceRange);
                        diag << SemanticFacts::getCaseConditionStr(cond) << it->first;
                        diag.addNote(diag::NotePreviousUsage, it->second->sourceRange);
                    }
                }
                else if (it->first.isInteger()) {
                    // Save off the values for later use in building the decision
                    // DAG. One weid thing here: if the value has x bits and we're
                    // not in a casex statement we should ignore the item, since we
                    // won't check for coverage of x bits in the decision DAG and these
                    // clauses will show up as unreachable otherwise.
                    auto& val = it->first.integer();
                    if (cond != CaseStatementCondition::WildcardJustZ || val.countXs() == 0) {
                        intVals.push_back(val.trunc(bitWidth));
                        itemExpressions.push_back(item);
                    }
                }
            }
            else {
                hasNonConstItems = true;
            }

            if (diagnostics && (cond == CaseStatementCondition::Normal ||
                                cond == CaseStatementCondition::WildcardJustZ)) {
                // If we're not in a wildcard case we should warn
                // about integer literal items that have unknown bits.
                // Similarly, if we're in a wildcard case with just Zs
                // we should warn if we see Xs.
                auto& unwrapped = item->unwrapImplicitConversions();
                if (unwrapped.kind == ExpressionKind::IntegerLiteral) {
                    auto& lit = unwrapped.as<IntegerLiteral>();
                    if (cond == CaseStatementCondition::Normal && lit.getValue().hasUnknown()) {
                        diagnostics->add(rootSymbol, diag::CaseNotWildcard, item->sourceRange);
                    }
                    else if (cond == CaseStatementCondition::WildcardJustZ &&
                             lit.getValue().countXs() > 0) {
                        diagnostics->add(rootSymbol, diag::CaseZWithX, item->sourceRange);
                    }
                }
            }
        }
    }

    std::optional<CaseDecisionDag> decisionDag;
    auto makeDecisionDag = [&]() {
        decisionDag.emplace(intVals, bitWidth, cond == CaseStatementCondition::WildcardXOrZ,
                            options.maxCaseAnalysisSteps);
    };

    // If diagnostics are enabled do various lint checks now.
    if (diagnostics) {
        // Check for missing enum coverage.
        if (caseType.isEnum()) {
            SmallVector<std::string_view> missing;
            for (auto& ev : caseType.getCanonicalType().as<EnumType>().values()) {
                auto& val = ev.getValue();
                if (!elems.contains(val))
                    missing.push_back(ev.name);
            }

            if (!missing.empty()) {
                std::string msg;
                if (missing.size() == 1) {
                    msg = fmt::format("value '{}'", missing[0]);
                }
                else if (missing.size() == 2) {
                    msg = fmt::format("values '{}' and '{}'", missing[0], missing[1]);
                }
                else if (missing.size() == 3) {
                    msg = fmt::format("values '{}', '{}', and '{}'", missing[0], missing[1],
                                      missing[2]);
                }
                else {
                    const size_t remainder = missing.size() - 3;
                    msg = fmt::format("values '{}', '{}', '{}' (and {} other{})", missing[0],
                                      missing[1], missing[2], remainder, remainder == 1 ? "" : "s");
                }

                auto code = stmt.defaultCase ? diag::CaseEnumExplicit : diag::CaseEnum;
                diagnostics->add(rootSymbol, code, stmt.expr.sourceRange) << msg;
            }
        }

        // If this is a wildcard case statement check for overlaps.
        if (wildcard) {
            makeDecisionDag();

            if (decisionDag->gaveUp) {
                auto& diag = diagnostics->add(rootSymbol, diag::CaseComplex, stmt.expr.sourceRange);
                diag << SemanticFacts::getCaseConditionStr(cond);
            }
            else {
                if (decisionDag->counterexample && !stmt.defaultCase) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseIncomplete,
                                                  stmt.expr.sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                    diag << *decisionDag->counterexample;
                }

                for (auto index : decisionDag->unreachableClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseUnreachable,
                                                  itemExpressions[index]->sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                }

                for (auto [first, second] : decisionDag->overlappingClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseOverlap,
                                                  itemExpressions[second]->sourceRange)
                                 << SemanticFacts::getCaseConditionStr(cond);
                    diag.addNote(diag::NotePreviousUsage, itemExpressions[first]->sourceRange);
                }
            }
        }
    }

    // If the case statement asserts it has full coverage, and our flags allow it,
    // assume full coverage without checking.
    if (options.flags.has(AnalysisFlags::FullCaseUniquePriority) &&
        (stmt.check == UniquePriorityCheck::Unique ||
         stmt.check == UniquePriorityCheck::Priority)) {
        return true;
    }

    // If the case type is not integral then we can never fully satisfy the condition.
    // Non-constant items or constant condition is also not coverable.
    if (!caseType.isIntegral() || hasNonConstItems || stmt.expr.eval(evalContext))
        return false;

    // TODO: handle case inside
    if (stmt.condition == CaseStatementCondition::Inside)
        return false;

    const bool fullCaseFourState = options.flags.has(AnalysisFlags::FullCaseFourState);
    if (stmt.condition == CaseStatementCondition::Normal || !caseType.isFourState()) {
        // The number of non-duplicate elements needs to match the number
        // of possible values for the case expression. This depends on
        // whether the type is 2-state or 4-state.
        if (caseType.isFourState() && fullCaseFourState)
            return bitWidth < 16 && elems.size() >= (size_t)std::pow(4, bitWidth);
        else
            return bitWidth < 32 && elems.size() >= (1ull << bitWidth);
    }

    // If we're checking for four-state wildcard coverage we simply need to
    // find an entry that is all Z bits. This is because Z is always a wildcard,
    // so the only way to specify an entry that hits all Z's will also cover
    // all other bits too.
    if (fullCaseFourState) {
        for (auto& val : intVals) {
            if (val.countLeadingZs() >= bitWidth)
                return true;
        }
        return false;
    }

    // Otherwise do the full wildcard coverage search.
    if (!decisionDag)
        makeDecisionDag();

    return decisionDag->isExhaustive();
}